

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::anon_unknown_2::LineWidthCase::test(LineWidthCase *this)

{
  float width;
  int local_3c;
  GLfloat reference;
  int i;
  int numIterations;
  float local_28 [2];
  GLfloat range [2];
  Random rnd;
  LineWidthCase *this_local;
  
  de::Random::Random((Random *)range,0xabcdef);
  local_28[0] = 1.0;
  local_28[1] = 0.0;
  glu::CallLogWrapper::glGetFloatv(&(this->super_ApiCase).super_CallLogWrapper,0x846e,local_28);
  ApiCase::expectError(&this->super_ApiCase,0);
  (*this->m_verifier->_vptr_StateVerifier[2])
            (0x3f800000,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb21);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (local_3c = 0; local_3c < 0x78; local_3c = local_3c + 1) {
    width = de::Random::getFloat((Random *)range,local_28[0],local_28[1]);
    glu::CallLogWrapper::glLineWidth(&(this->super_ApiCase).super_CallLogWrapper,width);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (width,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb21);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  de::Random::~Random((Random *)range);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		GLfloat range[2] = {1};
		glGetFloatv(GL_ALIASED_LINE_WIDTH_RANGE, range);
		expectError(GL_NO_ERROR);

		m_verifier->verifyFloat(m_testCtx, GL_LINE_WIDTH, 1.0f);
		expectError(GL_NO_ERROR);

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			const GLfloat reference = rnd.getFloat(range[0], range[1]);

			glLineWidth(reference);
			m_verifier->verifyFloat(m_testCtx, GL_LINE_WIDTH, reference);
			expectError(GL_NO_ERROR);
		}
	}